

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void __thiscall
google::protobuf::Reflection::InternalSwap(Reflection *this,Message *lhs,Message *rhs)

{
  ReflectionSchema *this_00;
  undefined4 uVar1;
  intptr_t iVar2;
  bool bVar3;
  byte bVar4;
  byte extraout_AL;
  uint32_t uVar5;
  uint32_t uVar6;
  CppStringType CVar7;
  FieldDescriptor *pFVar8;
  Descriptor *pDVar9;
  Nonnull<const_char_*> pcVar10;
  byte bVar11;
  int iVar12;
  int iVar13;
  FieldDescriptor *field;
  ulong uVar14;
  uint uVar15;
  ReflectionSchema *unaff_RBX;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  InternalMetadata *pIVar19;
  uint *unaff_R13;
  long lVar20;
  
  if (lhs == rhs) {
    return;
  }
  iVar2 = (lhs->super_MessageLite)._internal_metadata_.ptr_;
  pFVar8 = (FieldDescriptor *)(rhs->super_MessageLite)._internal_metadata_.ptr_;
  (lhs->super_MessageLite)._internal_metadata_.ptr_ = (intptr_t)pFVar8;
  (rhs->super_MessageLite)._internal_metadata_.ptr_ = iVar2;
  if (-1 < this->last_non_weak_field_index_) {
    unaff_R13 = (uint *)0xffffffffffffffff;
    unaff_RBX = (ReflectionSchema *)0x0;
    do {
      unaff_R13 = (uint *)((long)unaff_R13 + 1);
      pDVar9 = this->descriptor_;
      lVar17 = (long)pDVar9->field_count_;
      if ((long)unaff_R13 < lVar17) {
        pcVar10 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar10 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            ((long)unaff_R13,lVar17,"index < field_count()");
      }
      if (pcVar10 != (Nonnull<const_char_*>)0x0) {
        InternalSwap();
        goto LAB_0025834c;
      }
      field = (FieldDescriptor *)(&pDVar9->fields_->super_SymbolBase + (long)unaff_RBX);
      bVar3 = internal::ReflectionSchema::InRealOneof(&this->schema_,field);
      if ((!bVar3) && (bVar3 = internal::ReflectionSchema::IsSplit(&this->schema_,field), !bVar3)) {
        UnsafeShallowSwapField(this,lhs,rhs,field);
        pFVar8 = field;
      }
      unaff_RBX = (ReflectionSchema *)((long)unaff_RBX + 0x58);
    } while ((long)unaff_R13 < (long)this->last_non_weak_field_index_);
  }
  bVar11 = (byte)pFVar8;
  this_00 = &this->schema_;
  pIVar19 = (InternalMetadata *)rhs;
  if ((this->schema_).split_offset_ == -1) {
LAB_00258025:
    uVar15 = this->descriptor_->real_oneof_decl_count_;
    unaff_RBX = (ReflectionSchema *)(ulong)uVar15;
    if (0 < (int)uVar15) {
      uVar16 = 0;
      do {
        pFVar8 = (FieldDescriptor *)Descriptor::real_oneof_decl(this->descriptor_,uVar16);
        SwapOneofField<true>(this,lhs,rhs,(OneofDescriptor *)pFVar8);
        uVar16 = uVar16 + 1;
      } while (uVar15 != uVar16);
    }
    bVar11 = (byte)pFVar8;
    if ((this->schema_).has_bits_offset_ != -1) {
      if ((this->schema_).has_bits_offset_ == -1) goto LAB_002582f6;
      uVar5 = internal::ReflectionSchema::HasBitsOffset(this_00);
      bVar11 = (byte)pFVar8;
      unaff_RBX = this_00;
      if ((this->schema_).has_bits_offset_ != -1) {
        uVar6 = internal::ReflectionSchema::HasBitsOffset(this_00);
        unaff_R13 = (uint *)(ulong)uVar6;
        pDVar9 = this->descriptor_;
        if (pDVar9->field_count_ < 1) {
          unaff_RBX = (ReflectionSchema *)0x0;
        }
        else {
          pIVar19 = (InternalMetadata *)0x0;
          lVar17 = 0;
          unaff_RBX = (ReflectionSchema *)0x0;
          do {
            bVar3 = internal::cpp::HasHasbit
                              ((FieldDescriptor *)
                               (&pDVar9->fields_->super_SymbolBase +
                               (long)&((MessageLite *)&pIVar19->ptr_)->_vptr_MessageLite));
            unaff_RBX = (ReflectionSchema *)(ulong)((int)unaff_RBX + (uint)bVar3);
            lVar17 = lVar17 + 1;
            pDVar9 = this->descriptor_;
            pFVar8 = (FieldDescriptor *)(long)pDVar9->field_count_;
            pIVar19 = pIVar19 + 0xb;
          } while (lVar17 < (long)pFVar8);
        }
        if (0 < (int)unaff_RBX) {
          pFVar8 = (FieldDescriptor *)((long)unaff_R13 + (long)rhs);
          uVar15 = (int)unaff_RBX + 0x1fU >> 5;
          unaff_RBX = (ReflectionSchema *)(ulong)uVar15;
          uVar14 = 1;
          if (1 < uVar15) {
            uVar14 = (ulong)uVar15;
          }
          uVar18 = 0;
          do {
            uVar1 = *(undefined4 *)
                     ((long)&(lhs->super_MessageLite)._vptr_MessageLite + uVar18 * 4 + (ulong)uVar5)
            ;
            *(undefined4 *)
             ((long)&(lhs->super_MessageLite)._vptr_MessageLite + uVar18 * 4 + (ulong)uVar5) =
                 *(undefined4 *)(&pFVar8->super_SymbolBase + uVar18 * 4);
            *(undefined4 *)(&pFVar8->super_SymbolBase + uVar18 * 4) = uVar1;
            uVar18 = uVar18 + 1;
          } while (uVar14 != uVar18);
        }
        goto LAB_00258106;
      }
      goto LAB_00258300;
    }
LAB_00258106:
    bVar11 = (byte)pFVar8;
    if ((this->schema_).inlined_string_donated_offset_ == -1) goto LAB_0025828f;
    if ((this->schema_).inlined_string_donated_offset_ == -1) goto LAB_0025830a;
    uVar5 = internal::ReflectionSchema::InlinedStringDonatedOffset(this_00);
    unaff_RBX = this_00;
    if ((this->schema_).inlined_string_donated_offset_ == -1) goto LAB_00258314;
    uVar6 = internal::ReflectionSchema::InlinedStringDonatedOffset(this_00);
    pDVar9 = this->descriptor_;
    iVar12 = 0;
    if (0 < pDVar9->field_count_) {
      lVar17 = 0;
      lVar20 = 0;
      iVar12 = 0;
      do {
        pFVar8 = pDVar9->fields_;
        if ((*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(&pFVar8->type_)[lVar17] * 4) == 9
            ) && (bVar11 = (&pFVar8->field_0x1)[lVar17], (bVar11 & 8) == 0)) {
          bVar3 = (bool)((bVar11 & 0x20) >> 5);
          if (0xbf < bVar11 == bVar3) {
            pcVar10 = (Nonnull<const_char_*>)0x0;
          }
          else {
            pcVar10 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                (bVar3,0xbf < bVar11,
                                 "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
          }
          if (pcVar10 != (Nonnull<const_char_*>)0x0) goto LAB_0025834c;
          if (((&pFVar8->field_0x1)[lVar17] & 0x20) == 0) {
            pFVar8 = (FieldDescriptor *)(&pFVar8->super_SymbolBase + lVar17);
            bVar3 = internal::ReflectionSchema::InRealOneof(this_00,pFVar8);
            if ((!bVar3) && (CVar7 = FieldDescriptor::cpp_string_type(pFVar8), CVar7 == kString)) {
              bVar3 = internal::ReflectionSchema::IsFieldInlined(this_00,pFVar8);
              iVar12 = iVar12 + (uint)bVar3;
            }
          }
        }
        lVar20 = lVar20 + 1;
        pDVar9 = this->descriptor_;
        lVar17 = lVar17 + 0x58;
      } while (lVar20 < pDVar9->field_count_);
    }
    pIVar19 = (InternalMetadata *)((long)&(lhs->super_MessageLite)._vptr_MessageLite + (ulong)uVar5)
    ;
    unaff_R13 = (uint *)((long)&(rhs->super_MessageLite)._vptr_MessageLite + (ulong)uVar6);
    uVar15 = 0;
    if (iVar12 != 0) {
      iVar13 = iVar12 + 0x3f;
      if (-1 < iVar12 + 0x20) {
        iVar13 = iVar12 + 0x20;
      }
      uVar15 = iVar13 >> 5;
    }
    uVar16 = *(uint *)&((MessageLite *)&pIVar19->ptr_)->_vptr_MessageLite;
    bVar11 = (byte)uVar16;
    bVar4 = (byte)*unaff_R13;
    if (((*unaff_R13 ^ uVar16) & 1) != 0) goto LAB_0025831e;
    pcVar10 = (Nonnull<const_char_*>)0x0;
  }
  else {
    if ((this->schema_).split_offset_ == -1) {
      InternalSwap();
    }
    else {
      uVar5 = internal::ReflectionSchema::SplitOffset(this_00);
      if ((this->schema_).split_offset_ != -1) {
        uVar6 = internal::ReflectionSchema::SplitOffset(this_00);
        pFVar8 = *(FieldDescriptor **)
                  ((long)&(lhs->super_MessageLite)._vptr_MessageLite + (ulong)uVar5);
        *(undefined8 *)((long)&(lhs->super_MessageLite)._vptr_MessageLite + (ulong)uVar5) =
             *(undefined8 *)((long)&(rhs->super_MessageLite)._vptr_MessageLite + (ulong)uVar6);
        *(FieldDescriptor **)((long)&(rhs->super_MessageLite)._vptr_MessageLite + (ulong)uVar6) =
             pFVar8;
        goto LAB_00258025;
      }
    }
    InternalSwap();
LAB_002582f6:
    InternalSwap();
LAB_00258300:
    InternalSwap();
LAB_0025830a:
    InternalSwap();
LAB_00258314:
    uVar15 = (uint)unaff_RBX;
    InternalSwap();
    bVar4 = extraout_AL;
LAB_0025831e:
    pcVar10 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                        ((bool)(~bVar11 & 1),(bool)(~bVar4 & 1),
                         "(lhs_donated_array[0] & 0x1u) == 0 == (rhs_donated_array[0] & 0x1u) == 0")
    ;
  }
  if (pcVar10 != (Nonnull<const_char_*>)0x0) {
LAB_00258359:
    InternalSwap();
  }
  if (0 < (int)uVar15) {
    uVar14 = 0;
    do {
      uVar16 = *(uint *)((long)&((MessageLite *)&pIVar19->ptr_)->_vptr_MessageLite + uVar14 * 4);
      *(uint *)((long)&((MessageLite *)&pIVar19->ptr_)->_vptr_MessageLite + uVar14 * 4) =
           unaff_R13[uVar14];
      unaff_R13[uVar14] = uVar16;
      uVar14 = uVar14 + 1;
    } while (uVar15 != uVar14);
  }
LAB_0025828f:
  if ((this->schema_).extensions_offset_ == -1) {
    return;
  }
  uVar5 = internal::ReflectionSchema::GetExtensionSetOffset(this_00);
  uVar6 = internal::ReflectionSchema::GetExtensionSetOffset(this_00);
  internal::ExtensionSet::InternalSwap
            ((ExtensionSet *)((long)&(lhs->super_MessageLite)._vptr_MessageLite + (ulong)uVar5),
             (ExtensionSet *)((long)&(rhs->super_MessageLite)._vptr_MessageLite + (ulong)uVar6));
  return;
LAB_0025834c:
  InternalSwap();
  goto LAB_00258359;
}

Assistant:

void Reflection::InternalSwap(Message* lhs, Message* rhs) const {
  if (lhs == rhs) return;

  MutableInternalMetadata(lhs)->InternalSwap(MutableInternalMetadata(rhs));

  for (int i = 0; i <= last_non_weak_field_index_; i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (schema_.InRealOneof(field)) continue;
    if (schema_.IsSplit(field)) {
      continue;
    }
    UnsafeShallowSwapField(lhs, rhs, field);
  }
  if (schema_.IsSplit()) {
    std::swap(*MutableSplitField(lhs), *MutableSplitField(rhs));
  }
  const int oneof_decl_count = descriptor_->real_oneof_decl_count();
  for (int i = 0; i < oneof_decl_count; i++) {
    const OneofDescriptor* oneof = descriptor_->real_oneof_decl(i);
    SwapOneofField<true>(lhs, rhs, oneof);
  }

  // Swapping bits need to happen after swapping fields, because the latter may
  // depend on the has bit information.
  if (schema_.HasHasbits()) {
    uint32_t* lhs_has_bits = MutableHasBits(lhs);
    uint32_t* rhs_has_bits = MutableHasBits(rhs);

    int fields_with_has_bits = 0;
    for (int i = 0; i < descriptor_->field_count(); i++) {
      const FieldDescriptor* field = descriptor_->field(i);
      if (internal::cpp::HasHasbit(field)) {
        ++fields_with_has_bits;
      }
    }

    int has_bits_size = (fields_with_has_bits + 31) / 32;

    for (int i = 0; i < has_bits_size; i++) {
      std::swap(lhs_has_bits[i], rhs_has_bits[i]);
    }
  }

  if (schema_.HasInlinedString()) {
    uint32_t* lhs_donated_array = MutableInlinedStringDonatedArray(lhs);
    uint32_t* rhs_donated_array = MutableInlinedStringDonatedArray(rhs);
    int inlined_string_count = 0;
    for (int i = 0; i < descriptor_->field_count(); i++) {
      const FieldDescriptor* field = descriptor_->field(i);
      if (field->cpp_type() != FieldDescriptor::CPPTYPE_STRING) continue;
      if (field->is_extension() || field->is_repeated() ||
          schema_.InRealOneof(field) ||
          field->cpp_string_type() != FieldDescriptor::CppStringType::kString ||
          !IsInlined(field)) {
        continue;
      }
      inlined_string_count++;
    }

    int donated_array_size = inlined_string_count == 0
                                 ? 0
                                 // One extra bit for the arena dtor tracking.
                                 : (inlined_string_count + 1 + 31) / 32;
    ABSL_CHECK_EQ((lhs_donated_array[0] & 0x1u) == 0,
                  (rhs_donated_array[0] & 0x1u) == 0);
    for (int i = 0; i < donated_array_size; i++) {
      std::swap(lhs_donated_array[i], rhs_donated_array[i]);
    }
  }

  if (schema_.HasExtensionSet()) {
    MutableExtensionSet(lhs)->InternalSwap(MutableExtensionSet(rhs));
  }
}